

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

String * __thiscall
Json::OurReader::getFormattedErrorMessages_abi_cxx11_
          (String *__return_storage_ptr__,OurReader *this)

{
  bool bVar1;
  String local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  String local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  reference local_70;
  ErrorInfo *error;
  const_iterator __end1;
  const_iterator __begin1;
  Errors *__range1;
  OurReader *this_local;
  String *formattedMessage;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::begin
            ((const_iterator *)&__end1._M_node,&this->errors_);
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::end
            ((const_iterator *)&error,&this->errors_);
  while (bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&error), bVar1) {
    local_70 = std::
               _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
               ::operator*((_Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
                            *)&__end1._M_node);
    getLocationLineAndColumn_abi_cxx11_(&local_d0,this,(local_70->token_).start_);
    std::operator+(&local_b0,"* ",&local_d0);
    std::operator+(&local_90,&local_b0,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::operator+(&local_120,"  ",&local_70->message_);
    std::operator+(&local_100,&local_120,"\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    if (local_70->extra_ != (Location)0x0) {
      getLocationLineAndColumn_abi_cxx11_(&local_180,this,local_70->extra_);
      std::operator+(&local_160,"See ",&local_180);
      std::operator+(&local_140,&local_160," for detail.\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
    }
    std::
    _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
    ::operator++((_Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
                  *)&__end1._M_node);
  }
  return __return_storage_ptr__;
}

Assistant:

String OurReader::getFormattedErrorMessages() const {
  String formattedMessage;
  for (const auto& error : errors_) {
    formattedMessage +=
        "* " + getLocationLineAndColumn(error.token_.start_) + "\n";
    formattedMessage += "  " + error.message_ + "\n";
    if (error.extra_)
      formattedMessage +=
          "See " + getLocationLineAndColumn(error.extra_) + " for detail.\n";
  }
  return formattedMessage;
}